

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.hpp
# Opt level: O1

string * __thiscall
CLI::Formatter::make_positionals_abi_cxx11_(string *__return_storage_ptr__,Formatter *this,App *app)

{
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> opts;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> local_a8;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> local_90;
  string local_78;
  string local_58;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<bool_(const_CLI::Option_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/CLI11/CLI/Formatter.hpp:35:26)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(const_CLI::Option_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/CLI11/CLI/Formatter.hpp:35:26)>
             ::_M_manager;
  App::get_options(&local_a8,app,(function<bool_(const_CLI::Option_*)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  if (local_a8.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>._M_impl
      .super__Vector_impl_data._M_start ==
      local_a8.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Positionals","");
    FormatterBase::get_label(&local_58,&this->super_FormatterBase,&local_78);
    std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::vector
              (&local_90,&local_a8);
    (*(this->super_FormatterBase)._vptr_FormatterBase[3])
              (__return_storage_ptr__,this,&local_58,1,&local_90);
    if (local_90.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.
                      super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_90.
                            super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.
                            super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_a8.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.
                    super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.
                          super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.
                          super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_positionals(const App *app) const {
    std::vector<const Option *> opts =
        app->get_options([](const Option *opt) { return !opt->get_group().empty() && opt->get_positional(); });

    if(opts.empty())
        return std::string();

    return make_group(get_label("Positionals"), true, opts);
}